

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryStats.cpp
# Opt level: O0

void DictionaryStats::OutputStats(void)

{
  double avgcd;
  double avgld;
  double dStack_f8;
  bool dumpInstances;
  double max_maxlookupdepth;
  double maxlookupdepth;
  double max_avgcollisiondepth;
  double avgcollisiondepth;
  double max_avglookupdepth;
  double avglookupdepth;
  double max_collisions;
  double collisions;
  double max_lookups;
  double lookups;
  double max_empty;
  double empty;
  double max_depth;
  double depth;
  double max_items;
  double items;
  double max_resizes;
  double resizes;
  double max_endSize;
  double endSize;
  double max_size;
  double size;
  DictionaryStats *instance;
  DictionaryType *type;
  DictionaryType *current;
  
  if (dictionaryTypes != (DictionaryType *)0x0) {
    CCLock::Enter(&dictionaryTypesCriticalSection.super_CCLock);
    type = dictionaryTypes;
    Output::Print(L"PROFILE DICTIONARY\n");
    Output::Print(L"%8s  %13s  %13s  %13s  %13s  %13s  %13s  %13s  %14s  %14s  %13s  %13s  %13s    %s\n"
                  ,L"Metric",L"StartSize",L"EndSize",L"Resizes",L"Items",L"MaxDepth",L"EmptyBuckets"
                  ,L"Lookups",L"Collisions",L"AvgLookupDepth",L"AvgCollDepth",L"MaxLookupDepth",
                  L"Instances",L"Type");
    for (; type != (DictionaryType *)0x0; type = type->pNext) {
      instance = (DictionaryStats *)type;
      size = (double)type->instances;
      max_size = 0.0;
      endSize = 0.0;
      max_endSize = 0.0;
      resizes = 0.0;
      max_resizes = 0.0;
      items = 0.0;
      max_items = 0.0;
      depth = 0.0;
      max_depth = 0.0;
      empty = 0.0;
      max_empty = 0.0;
      lookups = 0.0;
      max_lookups = 0.0;
      collisions = 0.0;
      max_collisions = 0.0;
      avglookupdepth = 0.0;
      max_avglookupdepth = 0.0;
      avgcollisiondepth = 0.0;
      max_avgcollisiondepth = 0.0;
      maxlookupdepth = 0.0;
      max_maxlookupdepth = 0.0;
      dStack_f8 = 0.0;
      for (; size != 0.0; size = *(double *)size) {
        ComputeStats(*(uint *)((long)size + 8),&max_size,&endSize);
        ComputeStats(*(uint *)((long)size + 0xc),&max_endSize,&resizes);
        ComputeStats(*(uint *)((long)size + 0x14),&max_resizes,&items);
        ComputeStats(*(uint *)((long)size + 0x18),&max_items,&depth);
        ComputeStats(*(uint *)((long)size + 0x1c),&max_depth,&empty);
        ComputeStats(*(uint *)((long)size + 0x10),&max_empty,&lookups);
        ComputeStats(*(uint *)((long)size + 0x20),&max_lookups,&collisions);
        ComputeStats(*(uint *)((long)size + 0x24),&max_collisions,&avglookupdepth);
        if (*(int *)((long)size + 0x20) != 0) {
          ComputeStats((double)*(uint *)((long)size + 0x28) / (double)*(uint *)((long)size + 0x20),
                       &max_avglookupdepth,&avgcollisiondepth);
        }
        if (*(int *)((long)size + 0x24) != 0) {
          ComputeStats((double)*(uint *)((long)size + 0x28) / (double)*(uint *)((long)size + 0x24),
                       &max_avgcollisiondepth,&maxlookupdepth);
        }
        ComputeStats(*(uint *)((long)size + 0x2c),&max_maxlookupdepth,&stack0xffffffffffffff08);
      }
      if ((double)DAT_01eb89ec <= empty) {
        Output::Print(L"%8s  %13.0f  %13.0f  %13.2f  %13.0f  %13.2f  %13.0f  %13.0f  %14.0f  %14.2f  %13.2f  %13.2f  %13d    %S\n"
                      ,max_size / (double)*(int *)&instance->pNext,
                      max_endSize / (double)*(int *)&instance->pNext,
                      max_resizes / (double)*(int *)&instance->pNext,
                      max_items / (double)*(int *)&instance->pNext,
                      max_depth / (double)*(int *)&instance->pNext,
                      max_empty / (double)*(int *)&instance->pNext,
                      max_lookups / (double)*(int *)&instance->pNext,
                      max_collisions / (double)*(int *)&instance->pNext,L"AVG:",
                      (ulong)*(uint *)&instance->pNext,&instance->countOfEmptyBuckets);
        Output::Print(L"%8s  %13.0f  %13.0f  %13.2f  %13.0f  %13.2f  %13.0f  %13.0f  %14.0f  %14.2f  %13.2f  %13.2f  %13d    %S\n\n"
                      ,endSize,resizes,items,depth,empty,lookups,collisions,avglookupdepth,L"MAX:",
                      (ulong)*(uint *)&instance->pNext,&instance->countOfEmptyBuckets);
      }
    }
    Output::Print(
                 L"====================================================================================\n"
                 );
    ClearStats();
    CCLock::Leave(&dictionaryTypesCriticalSection.super_CCLock);
  }
  return;
}

Assistant:

void DictionaryStats::OutputStats()
{
    if (!dictionaryTypes)
        return;

    DictionaryStats::dictionaryTypesCriticalSection.Enter();
    DictionaryType* current = dictionaryTypes;
    Output::Print(_u("PROFILE DICTIONARY\n"));
    Output::Print(_u("%8s  %13s  %13s  %13s  %13s  %13s  %13s  %13s  %14s  %14s  %13s  %13s  %13s    %s\n"), _u("Metric"),_u("StartSize"), _u("EndSize"), _u("Resizes"), _u("Items"), _u("MaxDepth"), _u("EmptyBuckets"), _u("Lookups"), _u("Collisions"), _u("AvgLookupDepth"), _u("AvgCollDepth"), _u("MaxLookupDepth"), _u("Instances"), _u("Type"));
    while(current)
    {
        DictionaryType *type = current;

        DictionaryStats *instance = type->instances;
        double size = 0, max_size = 0;
        double endSize = 0, max_endSize = 0;
        double resizes = 0, max_resizes = 0;
        double items = 0, max_items = 0;
        double depth = 0, max_depth = 0;
        double empty = 0, max_empty = 0;
        double lookups = 0, max_lookups = 0;
        double collisions = 0, max_collisions = 0;
        double avglookupdepth = 0, max_avglookupdepth = 0;
        double avgcollisiondepth = 0, max_avgcollisiondepth = 0;
        double maxlookupdepth = 0, max_maxlookupdepth = 0;

        bool dumpInstances = false;
        //if(strstr(type->name, "SimpleDictionaryPropertyDescriptor") != nullptr)
        //{
        //    dumpInstances = true;
        //}
        while(instance)
        {
            ComputeStats(instance->initialSize, size, max_size);
            ComputeStats(instance->finalSize, endSize, max_endSize);
            ComputeStats(instance->countOfResize, resizes, max_resizes);
            ComputeStats(instance->itemCount, items, max_items);
            ComputeStats(instance->maxDepth, depth, max_depth);
            ComputeStats(instance->countOfEmptyBuckets, empty, max_empty);
            ComputeStats(instance->lookupCount, lookups, max_lookups);
            ComputeStats(instance->collisionCount, collisions, max_collisions);
            if (instance->lookupCount > 0)
            {
                ComputeStats((double)instance->lookupDepthTotal / (double)instance->lookupCount, avglookupdepth, max_avglookupdepth);
            }
            if (instance->collisionCount > 0)
            {
                ComputeStats((double)instance->lookupDepthTotal / (double)instance->collisionCount, avgcollisiondepth, max_avgcollisiondepth);
            }
            ComputeStats(instance->maxLookupDepth, maxlookupdepth, max_maxlookupdepth);

            if(dumpInstances)
            {
                double avgld = 0.0;
                double avgcd = 0.0;
                if (instance->lookupCount > 0)
                {
                    avgld = (double)instance->lookupDepthTotal / (double)instance->lookupCount;
                    avgcd = (double)instance->lookupDepthTotal / (double)instance->collisionCount;
                }
                Output::Print(_u("%8s  %13d  %13d  %13d  %13d  %13d  %13d  %13d  %14d  %14.2f  %13.2f  %13d \n"),
                    _u("INS:"),
                    instance->initialSize, instance->finalSize, instance->countOfResize,
                    instance->itemCount, instance->maxDepth, instance->countOfEmptyBuckets,
                    instance->lookupCount, instance->collisionCount, avgld, avgcd,
                    instance->maxLookupDepth);
            }
            instance = instance->pNext;
        }

        if (max_depth >= Js::Configuration::Global.flags.ProfileDictionary)
        {
            Output::Print(_u("%8s  %13.0f  %13.0f  %13.2f  %13.0f  %13.2f  %13.0f  %13.0f  %14.0f  %14.2f  %13.2f  %13.2f  %13d    %S\n"), _u("AVG:"),
                size/type->instancesCount, endSize/type->instancesCount, resizes/type->instancesCount, items/type->instancesCount,
                depth/type->instancesCount, empty/type->instancesCount, lookups/type->instancesCount, collisions/type->instancesCount,
                avglookupdepth/type->instancesCount, avgcollisiondepth/type->instancesCount, maxlookupdepth/type->instancesCount, type->instancesCount, type->name);
            Output::Print(_u("%8s  %13.0f  %13.0f  %13.2f  %13.0f  %13.2f  %13.0f  %13.0f  %14.0f  %14.2f  %13.2f  %13.2f  %13d    %S\n\n"), _u("MAX:"),
                max_size, max_endSize, max_resizes, max_items, max_depth, max_empty, max_lookups, max_collisions, max_avglookupdepth,
                max_avgcollisiondepth, max_maxlookupdepth, type->instancesCount, type->name);

        }
        current = current->pNext;
    }
    Output::Print(_u("====================================================================================\n"));
    ClearStats();
    DictionaryStats::dictionaryTypesCriticalSection.Leave();
}